

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  long lVar1;
  ulong uVar2;
  size_t j;
  ulong uVar3;
  mbedtls_mpi_uint mask;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = X->n;
  if (sVar5 == 0) {
    return 0;
  }
  lVar1 = sVar5 * 0x40 + 0x40;
  do {
    sVar5 = sVar5 - 1;
    if (sVar5 == 0) {
      uVar2 = *X->p;
      lVar1 = 0x40;
      break;
    }
    uVar2 = X->p[sVar5];
    lVar1 = lVar1 + -0x40;
  } while (uVar2 == 0);
  uVar3 = 0;
  for (uVar4 = 0x8000000000000000; (uVar3 < 0x40 && ((uVar4 & uVar2) == 0)); uVar4 = uVar4 >> 1) {
    uVar3 = uVar3 + 1;
  }
  return lVar1 - uVar3;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    j = biL - mbedtls_clz( X->p[i] );

    return( ( i * biL ) + j );
}